

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O1

void jinit_upsampler(j_decompress_ptr cinfo)

{
  int iVar1;
  int iVar2;
  jpeg_error_mgr *pjVar3;
  _func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *p_Var4;
  jpeg_upsampler *pjVar5;
  long lVar6;
  int iVar7;
  code *pcVar8;
  long lVar9;
  int iVar10;
  jpeg_upsampler *pjVar11;
  boolean *pbVar12;
  
  pjVar5 = (jpeg_upsampler *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
  cinfo->upsample = pjVar5;
  pjVar5->start_pass = start_pass_upsample;
  pjVar5->upsample = sep_upsample;
  pjVar5->need_context_rows = 0;
  if (cinfo->CCIR601_sampling != 0) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x1a;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  if (0 < cinfo->num_components) {
    pbVar12 = &cinfo->comp_info->component_needed;
    lVar9 = 0;
    do {
      iVar10 = (pbVar12[-4] * pbVar12[-0xb]) / cinfo->min_DCT_h_scaled_size;
      iVar7 = (pbVar12[-3] * pbVar12[-10]) / cinfo->min_DCT_v_scaled_size;
      iVar1 = cinfo->max_h_samp_factor;
      iVar2 = cinfo->max_v_samp_factor;
      *(int *)((long)&pjVar5[8].start_pass + lVar9 * 4) = iVar7;
      pcVar8 = noop_upsample;
      pjVar11 = (jpeg_upsampler *)&pjVar5[4].upsample;
      if ((*pbVar12 != 0) && ((iVar10 != iVar1 || (pcVar8 = fullsize_upsample, iVar7 != iVar2)))) {
        if ((iVar10 * 2 == iVar1) && (iVar7 == iVar2)) {
          pcVar8 = h2v1_upsample;
LAB_0027df3c:
          (&pjVar5[4].upsample)[lVar9] = pcVar8;
        }
        else {
          if ((iVar10 * 2 == iVar1) && (iVar7 * 2 == iVar2)) {
            pcVar8 = h2v2_upsample;
            goto LAB_0027df3c;
          }
          if (iVar1 % iVar10 == 0) {
            if (iVar2 % iVar7 != 0) goto LAB_0027df55;
            (&pjVar5[4].upsample)[lVar9] = int_upsample;
            *(char *)((long)&pjVar5[9].need_context_rows + lVar9) = (char)(iVar1 / iVar10);
            *(char *)((long)&pjVar5[10].start_pass + lVar9 + 2) = (char)(iVar2 / iVar7);
          }
          else {
LAB_0027df55:
            pjVar3 = cinfo->err;
            pjVar3->msg_code = 0x27;
            (*pjVar3->error_exit)((j_common_ptr)cinfo);
          }
        }
        p_Var4 = cinfo->mem->alloc_sarray;
        lVar6 = jround_up((ulong)cinfo->output_width,(long)cinfo->max_h_samp_factor);
        pcVar8 = (code *)(*p_Var4)((j_common_ptr)cinfo,1,(JDIMENSION)lVar6,cinfo->max_v_samp_factor)
        ;
        pjVar11 = pjVar5 + 1;
      }
      (&pjVar11->start_pass)[lVar9] = pcVar8;
      lVar9 = lVar9 + 1;
      pbVar12 = pbVar12 + 0x18;
    } while (lVar9 < cinfo->num_components);
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_upsampler (j_decompress_ptr cinfo)
{
  my_upsample_ptr upsample;
  int ci;
  jpeg_component_info * compptr;
  boolean need_buffer;
  int h_in_group, v_in_group, h_out_group, v_out_group;

  upsample = (my_upsample_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_upsampler));
  cinfo->upsample = (struct jpeg_upsampler *) upsample;
  upsample->pub.start_pass = start_pass_upsample;
  upsample->pub.upsample = sep_upsample;
  upsample->pub.need_context_rows = FALSE; /* until we find out differently */

  if (cinfo->CCIR601_sampling)	/* this isn't supported */
    ERREXIT(cinfo, JERR_CCIR601_NOTIMPL);

  /* Verify we can handle the sampling factors, select per-component methods,
   * and create storage as needed.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Compute size of an "input group" after IDCT scaling.  This many samples
     * are to be converted to max_h_samp_factor * max_v_samp_factor pixels.
     */
    h_in_group = (compptr->h_samp_factor * compptr->DCT_h_scaled_size) /
		 cinfo->min_DCT_h_scaled_size;
    v_in_group = (compptr->v_samp_factor * compptr->DCT_v_scaled_size) /
		 cinfo->min_DCT_v_scaled_size;
    h_out_group = cinfo->max_h_samp_factor;
    v_out_group = cinfo->max_v_samp_factor;
    upsample->rowgroup_height[ci] = v_in_group; /* save for use later */
    need_buffer = TRUE;
    if (! compptr->component_needed) {
      /* Don't bother to upsample an uninteresting component. */
      upsample->methods[ci] = noop_upsample;
      need_buffer = FALSE;
    } else if (h_in_group == h_out_group && v_in_group == v_out_group) {
      /* Fullsize components can be processed without any work. */
      upsample->methods[ci] = fullsize_upsample;
      need_buffer = FALSE;
    } else if (h_in_group * 2 == h_out_group &&
	       v_in_group == v_out_group) {
      /* Special case for 2h1v upsampling */
      upsample->methods[ci] = h2v1_upsample;
    } else if (h_in_group * 2 == h_out_group &&
	       v_in_group * 2 == v_out_group) {
      /* Special case for 2h2v upsampling */
      upsample->methods[ci] = h2v2_upsample;
    } else if ((h_out_group % h_in_group) == 0 &&
	       (v_out_group % v_in_group) == 0) {
      /* Generic integral-factors upsampling method */
      upsample->methods[ci] = int_upsample;
      upsample->h_expand[ci] = (UINT8) (h_out_group / h_in_group);
      upsample->v_expand[ci] = (UINT8) (v_out_group / v_in_group);
    } else
      ERREXIT(cinfo, JERR_FRACT_SAMPLE_NOTIMPL);
    if (need_buffer) {
      upsample->color_buf[ci] = (*cinfo->mem->alloc_sarray)
	((j_common_ptr) cinfo, JPOOL_IMAGE,
	 (JDIMENSION) jround_up((long) cinfo->output_width,
				(long) cinfo->max_h_samp_factor),
	 (JDIMENSION) cinfo->max_v_samp_factor);
    }
  }
}